

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O0

App * __thiscall CLI::App::ignore_case(App *this,bool value)

{
  byte bVar1;
  bool bVar2;
  string *__rhs;
  undefined8 uVar3;
  byte in_SIL;
  App *in_RDI;
  string *match;
  App *p;
  App *in_stack_00000108;
  App *in_stack_00000110;
  App *in_stack_00000118;
  App *local_60;
  string *in_stack_ffffffffffffffd8;
  undefined7 in_stack_fffffffffffffff0;
  
  bVar1 = in_SIL & 1;
  if ((bVar1 != 0) && ((in_RDI->ignore_case_ & 1U) == 0)) {
    in_RDI->ignore_case_ = true;
    local_60 = in_RDI;
    if (in_RDI->parent_ != (App *)0x0) {
      local_60 = _get_fallthrough_parent
                           ((App *)(CONCAT17(in_SIL,in_stack_fffffffffffffff0) & 0x1ffffffffffffff))
      ;
    }
    __rhs = _compare_subcommand_names_abi_cxx11_
                      (in_stack_00000118,in_stack_00000110,in_stack_00000108);
    bVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1978c7
                      );
    if (!bVar2) {
      in_RDI->ignore_case_ = false;
      uVar3 = __cxa_allocate_exception(0x38);
      ::std::operator+((char *)local_60,__rhs);
      OptionAlreadyAdded::OptionAlreadyAdded((OptionAlreadyAdded *)__rhs,in_stack_ffffffffffffffd8);
      __cxa_throw(uVar3,&OptionAlreadyAdded::typeinfo,OptionAlreadyAdded::~OptionAlreadyAdded);
    }
  }
  in_RDI->ignore_case_ = (bool)(bVar1 & 1);
  return in_RDI;
}

Assistant:

CLI11_INLINE App *App::ignore_case(bool value) {
    if(value && !ignore_case_) {
        ignore_case_ = true;
        auto *p = (parent_ != nullptr) ? _get_fallthrough_parent() : this;
        const auto &match = _compare_subcommand_names(*this, *p);
        if(!match.empty()) {
            ignore_case_ = false;  // we are throwing so need to be exception invariant
            throw OptionAlreadyAdded("ignore case would cause subcommand name conflicts: " + match);
        }
    }
    ignore_case_ = value;
    return this;
}